

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::rowDualBoundsDominatedColumns(HPresolve *this)

{
  double *pdVar1;
  double dVar2;
  int j;
  _List_node_base *p_Var3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  int iVar7;
  ostream *poVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  p_Var3 = (this->singCol).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  do {
    if (p_Var3 == (_List_node_base *)&this->singCol) {
      return;
    }
    j = *(int *)&p_Var3[1]._M_next;
    uVar10 = (ulong)j;
    piVar4 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar12 = uVar10;
    if ((ulong)((long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= uVar10)
    goto LAB_0013fe05;
    if (piVar4[uVar10] != 0) {
      iVar7 = getSingColElementIndexInA(this,j);
      uVar11 = (ulong)iVar7;
      piVar4 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar11;
      if ((ulong)((long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= uVar11)
      goto LAB_0013fe05;
      iVar7 = piVar4[uVar11];
      uVar13 = (ulong)iVar7;
      piVar4 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar13;
      if ((ulong)((long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2) <= uVar13)
      goto LAB_0013fe05;
      if (piVar4[uVar13] == 0) {
        poVar8 = std::operator<<((ostream *)&std::cout,"ERROR: column singleton ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,j);
        poVar8 = std::operator<<(poVar8," is in row ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
        std::operator<<(poVar8," which is already mapped off\n");
        exit(-1);
      }
      pdVar5 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar10;
      if ((ulong)((long)(this->super_HPreData).colLower.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar10)
      goto LAB_0013fe05;
      dVar14 = pdVar5[uVar10];
      if ((dVar14 != -1e+200) || (NAN(dVar14))) {
        pdVar5 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colUpper.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar10)
        goto LAB_0013fe05;
        dVar2 = pdVar5[uVar10];
        if ((dVar2 != 1e+200) || (NAN(dVar2))) goto LAB_0013fdcf;
      }
      if (dVar14 <= -1e+200) {
LAB_0013fb52:
        if ((dVar14 == -1e+200) && (!NAN(dVar14))) {
          pdVar5 = (this->super_HPreData).colUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).colUpper.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar10)
          goto LAB_0013fe05;
          pdVar1 = pdVar5 + uVar10;
          if (1e+200 < *pdVar1 || *pdVar1 == 1e+200) {
            if ((dVar14 == -1e+200) && (!NAN(dVar14))) {
              pdVar5 = (this->super_HPreData).colUpper.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(this->super_HPreData).colUpper.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar10)
              goto LAB_0013fe05;
              dVar14 = pdVar5[uVar10];
              if ((dVar14 == 1e+200) && (!NAN(dVar14))) {
                pdVar5 = (this->super_HPreData).colCost.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (((ulong)((long)(this->super_HPreData).colCost.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar10)
                   || ((pdVar6 = (this->super_HPreData).Avalue.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start, uVar12 = uVar11,
                       (ulong)((long)(this->super_HPreData).Avalue.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <=
                       uVar11 || (pdVar9 = (this->implRowDualLower).
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start, uVar12 = uVar13
                                 , (ulong)((long)(this->implRowDualLower).
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pdVar9 >> 3) <= uVar13)))) goto LAB_0013fe05;
                dVar14 = pdVar5[uVar10] / pdVar6[uVar11];
                if (pdVar9[uVar13] <= dVar14 && dVar14 != pdVar9[uVar13]) {
                  pdVar9[uVar13] = dVar14;
                }
                pdVar9 = (this->implRowDualUpper).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->implRowDualUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar13)
                goto LAB_0013fe05;
                if (pdVar5[uVar10] / pdVar6[uVar11] < pdVar9[uVar13]) {
                  pdVar9[uVar13] = pdVar5[uVar10] / pdVar6[uVar11];
                }
              }
            }
          }
          else {
            pdVar5 = (this->super_HPreData).Avalue.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = uVar11;
            if ((ulong)((long)(this->super_HPreData).Avalue.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar11)
            goto LAB_0013fe05;
            dVar14 = pdVar5[uVar11];
            if (0.0 < dVar14) {
              pdVar6 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar12 = uVar10;
              if (((ulong)((long)(this->super_HPreData).colCost.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
                 || (pdVar9 = (this->implRowDualLower).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start, uVar12 = uVar13,
                    (ulong)((long)(this->implRowDualLower).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar13))
              goto LAB_0013fe05;
              dVar2 = pdVar6[uVar10];
              dVar15 = dVar2 / dVar14;
              pdVar1 = pdVar9 + uVar13;
              if (*pdVar1 <= dVar15 && dVar15 != *pdVar1) {
                pdVar6 = (this->implRowDualUpper).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(this->implRowDualUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar13)
                goto LAB_0013fe05;
                pdVar6[uVar13] = -dVar2 / dVar14;
              }
            }
            if (pdVar5[uVar11] < 0.0) {
              pdVar6 = (this->super_HPreData).colCost.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar12 = uVar10;
              if (((ulong)((long)(this->super_HPreData).colCost.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10)
                 || (pdVar9 = (this->implRowDualUpper).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start, uVar12 = uVar13,
                    (ulong)((long)(this->implRowDualUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar13))
              goto LAB_0013fe05;
              dVar14 = pdVar6[uVar10] / pdVar5[uVar11];
              if (dVar14 < pdVar9[uVar13]) goto LAB_0013fc97;
            }
          }
        }
      }
      else {
        pdVar5 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->super_HPreData).colUpper.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar10)
        goto LAB_0013fe05;
        dVar2 = pdVar5[uVar10];
        if ((dVar2 != 1e+200) || (NAN(dVar2))) goto LAB_0013fb52;
        pdVar5 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar12 = uVar11;
        if ((ulong)((long)(this->super_HPreData).Avalue.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar11)
        goto LAB_0013fe05;
        if (0.0 < pdVar5[uVar11]) {
          pdVar6 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = uVar10;
          if (((ulong)((long)(this->super_HPreData).colCost.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10) ||
             (pdVar9 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, uVar12 = uVar13,
             (ulong)((long)(this->implRowDualUpper).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar13))
          goto LAB_0013fe05;
          dVar14 = pdVar6[uVar10] / pdVar5[uVar11];
          if (dVar14 < pdVar9[uVar13]) {
            pdVar9[uVar13] = dVar14;
          }
        }
        if (pdVar5[uVar11] < 0.0) {
          pdVar6 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar12 = uVar10;
          if (((ulong)((long)(this->super_HPreData).colCost.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar10) ||
             (pdVar9 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start, uVar12 = uVar13,
             (ulong)((long)(this->implRowDualLower).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar9 >> 3) <= uVar13))
          goto LAB_0013fe05;
          dVar14 = pdVar6[uVar10] / pdVar5[uVar11];
          if (dVar14 < pdVar9[uVar13] || dVar14 == pdVar9[uVar13]) goto LAB_0013fd89;
LAB_0013fc97:
          pdVar9[uVar13] = dVar14;
        }
      }
LAB_0013fd89:
      pdVar5 = (this->implRowDualLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar12 = uVar13;
      if (((ulong)((long)(this->implRowDualLower).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar13) ||
         (pdVar6 = (this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         (ulong)((long)(this->implRowDualUpper).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar13)) {
LAB_0013fe05:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar12);
      }
      dVar14 = pdVar5[uVar13];
      pdVar1 = pdVar6 + uVar13;
      if (*pdVar1 <= dVar14 && dVar14 != *pdVar1) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "Error: inconstistent bounds for Lagrange multiplier for row ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar7);
        poVar8 = std::operator<<(poVar8," detected after column singleton ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,j);
        poVar8 = std::operator<<(poVar8,". In presolve::dominatedColumns");
        std::endl<char,std::char_traits<char>>(poVar8);
        exit(0);
      }
    }
LAB_0013fdcf:
    p_Var3 = p_Var3->_M_next;
  } while( true );
}

Assistant:

void HPresolve::rowDualBoundsDominatedColumns() {
	int col, i, k;

	//for each row calc yihat and yibar and store in implRowDualLower and implRowDualUpper
	for (list<int>::iterator it = singCol.begin(); it != singCol.end(); ++it)
		if (flagCol.at(*it)) {
			col = *it;
			k = getSingColElementIndexInA(col);
			i = Aindex.at(k);

			if (!flagRow.at(i)) {
				cout<<"ERROR: column singleton "<<col<<" is in row "<<i<<" which is already mapped off\n";
				exit(-1);
			}

			if (colLower.at(col) == -HSOL_CONST_INF || colUpper.at(col) == HSOL_CONST_INF) {

				if (colLower.at(col) > -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF)  {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) < HSOL_CONST_INF) {
					if (Avalue.at(k)>0)
						if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualUpper.at(i) = -colCost.at(col)/Avalue.at(k);
					if (Avalue.at(k)<0)
						if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}
				else if (colLower.at(col) == -HSOL_CONST_INF && colUpper.at(col) == HSOL_CONST_INF) {
					//all should be removed earlier but use them
					if ((colCost.at(col)/Avalue.at(k)) > implRowDualLower.at(i))
							implRowDualLower.at(i) = colCost.at(col)/Avalue.at(k);
					if ((colCost.at(col)/Avalue.at(k)) < implRowDualUpper.at(i))
							implRowDualUpper.at(i) = colCost.at(col)/Avalue.at(k);
				}

				if (implRowDualLower.at(i) > implRowDualUpper.at(i)) {
					cout<<"Error: inconstistent bounds for Lagrange multiplier for row "<< i<< " detected after column singleton "<<col<<". In presolve::dominatedColumns"<<endl;
					exit(0);
				}
			}
		}

}